

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

int input_bit(uchar *infile)

{
  uchar *infile_local;
  
  if (bits_to_go == 0) {
    buffer2 = (int)infile[nextchar];
    nextchar = nextchar + 1;
    bits_to_go = 8;
  }
  bits_to_go = bits_to_go + -1;
  return buffer2 >> ((byte)bits_to_go & 0x1f) & 1;
}

Assistant:

static int input_bit(unsigned char *infile)
{
	if (bits_to_go == 0) {			/* Read the next byte if no	*/

		buffer2 = infile[nextchar];
		nextchar++;
		
		bits_to_go = 8;
	}
	/*
	 * Return the next bit
	 */
	bits_to_go -= 1;
	return((buffer2>>bits_to_go) & 1);
}